

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O2

void __thiscall sf::WindowBase::initialize(WindowBase *this)

{
  Vector2u VVar1;
  uint extraout_var;
  
  (*this->m_impl->_vptr_WindowImpl[9])(this->m_impl,1);
  (*this->m_impl->_vptr_WindowImpl[10])(this->m_impl,1);
  (*this->m_impl->_vptr_WindowImpl[0xd])(this->m_impl,1);
  VVar1.x = (*this->m_impl->_vptr_WindowImpl[5])();
  VVar1.y = extraout_var;
  this->m_size = VVar1;
  (*this->_vptr_WindowBase[5])(this);
  return;
}

Assistant:

void WindowBase::initialize()
{
    // Setup default behaviors (to get a consistent behavior across different implementations)
    setVisible(true);
    setMouseCursorVisible(true);
    setKeyRepeatEnabled(true);

    // Get and cache the initial size of the window
    m_size = m_impl->getSize();

    // Notify the derived class
    onCreate();
}